

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O3

FDecalTemplate * __thiscall FDecalLib::GetDecalByNum(FDecalLib *this,WORD num)

{
  int iVar1;
  FDecalBase *pFVar2;
  undefined4 extraout_var;
  undefined6 in_register_00000032;
  
  if ((int)CONCAT62(in_register_00000032,num) != 0) {
    pFVar2 = ScanTreeForNum(num,this->Root);
    if (pFVar2 != (FDecalBase *)0x0) {
      iVar1 = (**pFVar2->_vptr_FDecalBase)(pFVar2);
      return (FDecalTemplate *)CONCAT44(extraout_var,iVar1);
    }
  }
  return (FDecalTemplate *)0x0;
}

Assistant:

const FDecalTemplate *FDecalLib::GetDecalByNum (WORD num) const
{
	if (num == 0)
	{
		return NULL;
	}
	FDecalBase *base = ScanTreeForNum (num, Root);
	if (base != NULL)
	{
		return base->GetDecal ();
	}
	return NULL;
}